

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O1

Float<unsigned_short,_5,_10,_15,_3U>
tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
          (Float<unsigned_int,_8,_23,_127,_3U> *other)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar2 = other->m_value;
  if ((uVar2 & 0x7fffffff) != 0x7f800000) {
    uVar8 = uVar2 & 0x7f800000;
    uVar5 = uVar2 & 0x7fffff;
    if (uVar8 == 0x7f800000 && uVar5 != 0) {
      return (Float<unsigned_short,_5,_10,_15,_3U>)0x7fff;
    }
    uVar4 = (ushort)(uVar2 >> 0x10);
    if ((uVar2 & 0x7fffffff) == 0) {
      return (Float<unsigned_short,_5,_10,_15,_3U>)uVar4;
    }
    uVar10 = (uVar2 >> 0x17 & 0xff) - 0x7f;
    uVar1 = uVar5 + 0x800000;
    if (uVar8 == 0 && uVar5 != 0) {
      uVar1 = uVar5;
      uVar10 = 0xffffff82;
    }
    uVar9 = (ulong)uVar1;
    if (uVar8 == 0 && uVar5 != 0) {
      lVar3 = 0x3f;
      if ((uVar1 & 0x7fffff) != 0) {
        for (; (uVar1 & 0x7fffff) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar9 = uVar9 << (~(byte)lVar3 + 0x18 & 0x3f);
      uVar10 = (uVar10 | 0x28) - ((uint)lVar3 ^ 0x3f);
    }
    if ((int)uVar10 < -0xe) {
      if ((int)uVar10 < -0x19) {
        return (Float<unsigned_short,_5,_10,_15,_3U>)(uVar4 & 0x8000);
      }
      return (Float<unsigned_short,_5,_10,_15,_3U>)
             (uVar4 & 0x8000 |
             (ushort)(~(-1L << (-(char)uVar10 - 2U & 0x3f)) + uVar9 +
                      (ulong)((uVar9 >> ((ulong)~uVar10 & 0x3f) & 1) != 0) >> ((byte)~uVar10 & 0x3f)
                     ));
    }
    uVar5 = ((uint)uVar9 & 0xff7fffff) + 0xfff + (uint)(((uint)uVar9 >> 0xd & 1) != 0);
    uVar8 = uVar5 & 0x800000;
    iVar7 = uVar10 + (uVar8 >> 0x17);
    if (iVar7 < 0x10) {
      uVar6 = 0;
      if (uVar8 == 0) {
        uVar6 = (ushort)(uVar5 >> 0xd);
      }
      return (Float<unsigned_short,_5,_10,_15,_3U>)
             (uVar6 | uVar4 & 0x8000 | (short)iVar7 * 0x400 + 0x3c00U);
    }
  }
  return (Float<unsigned_short,_5,_10,_15,_3U>)((ushort)(-1 < (int)uVar2) * -0x8000 - 0x400);
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}